

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::LiteTest_DownCastMessageInvalidPointerType_Test::TestBody
          (LiteTest_DownCastMessageInvalidPointerType_Test *this)

{
  bool bVar1;
  DeathTest *pDVar2;
  bool bVar3;
  int iVar4;
  char *message;
  AlphaNum *in_R9;
  DeathTest *gtest_dt;
  ReturnSentinel gtest_sentinel;
  char *local_468;
  string_view local_440 [3];
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_410;
  string local_3f8;
  AlphaNum local_3d8;
  AlphaNum local_3a8;
  CastType1 test_type_1;
  
  proto2_unittest::TestAllTypesLite::TestAllTypesLite(&test_type_1);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_440[0] = absl::lts_20250127::NullSafeStringView("Cannot downcast ");
    _gtest_sentinel = MessageLite::GetTypeName(&test_type_1.super_MessageLite);
    local_3d8.piece_ = absl::lts_20250127::NullSafeStringView(" to ");
    local_3a8.piece_ =
         MessageLite::GetTypeName
                   ((MessageLite *)&proto2_unittest::_TestPackedTypesLite_default_instance_);
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_3f8,(lts_20250127 *)local_440,(AlphaNum *)&gtest_sentinel,&local_3d8,
               &local_3a8,in_R9);
    testing::internal::MakeDeathTestMatcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_410,&local_3f8);
    bVar3 = testing::internal::DeathTest::Create
                      ("DownCastMessage<CastType2>(test_type_1_pointer)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_410,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
                       ,0x5a6,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_410);
    std::__cxx11::string::~string((string *)&local_3f8);
    pDVar2 = gtest_dt;
    if (bVar3) {
      if (gtest_dt == (DeathTest *)0x0) goto LAB_0013fb7e;
      iVar4 = (*gtest_dt->_vptr_DeathTest[2])(gtest_dt);
      if (iVar4 == 0) {
        iVar4 = (*gtest_dt->_vptr_DeathTest[3])(gtest_dt);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar4);
        iVar4 = (*gtest_dt->_vptr_DeathTest[4])(gtest_dt,(ulong)bVar3);
        if ((char)iVar4 != '\0') goto LAB_0013fb12;
        bVar1 = true;
        bVar3 = false;
      }
      else {
        if (iVar4 == 1) {
          gtest_sentinel.test_ = gtest_dt;
          bVar3 = testing::internal::AlwaysTrue();
          if (bVar3) {
            DownCastMessage<proto2_unittest::TestPackedTypesLite>(&test_type_1.super_MessageLite);
          }
          (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
        }
LAB_0013fb12:
        bVar3 = true;
        bVar1 = false;
      }
      (*pDVar2->_vptr_DeathTest[1])(pDVar2);
      if ((bVar3) || (!bVar1)) goto LAB_0013fb7e;
    }
  }
  testing::Message::Message((Message *)local_440);
  message = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_sentinel,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
             ,0x5a6,message);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)local_440);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
  if ((long *)local_440[0]._M_len != (long *)0x0) {
    (**(code **)(*(long *)local_440[0]._M_len + 8))();
  }
LAB_0013fb7e:
  proto2_unittest::TestAllTypesLite::~TestAllTypesLite(&test_type_1);
  return;
}

Assistant:

TEST(LiteTest, DownCastMessageInvalidPointerType) {
  CastType1 test_type_1;

  MessageLite* test_type_1_pointer = &test_type_1;

  ASSERT_DEBUG_DEATH(
      DownCastMessage<CastType2>(test_type_1_pointer),
      absl::StrCat("Cannot downcast ", test_type_1.GetTypeName(), " to ",
                   CastType2::default_instance().GetTypeName()));
}